

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockOffsetContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  LayoutQualifier *this;
  ArrayElement *pAVar1;
  TestNode *pTVar2;
  Node *pNVar3;
  Variable *pVVar4;
  ResourceTestCase *pRVar5;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr memberVariable;
  SharedPtr arrayElement;
  SharedPtr structMember;
  SharedPtr elementVariable;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,0x200);
  pNVar3 = parentStructure->m_ptr;
  if (pNVar3->m_type == TYPE_INTERFACE_BLOCK) {
    if ((*(char *)&pNVar3[1]._vptr_Node == '\0') ||
       (((pNVar3->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)) {
      generateVariableCases(context,parentStructure,targetGroup,&queryTarget,1,true);
      generateVariableArrayCases(context,parentStructure,targetGroup,&queryTarget,1);
      generateCompoundVariableCases(context,parentStructure,targetGroup,&queryTarget,1);
      return;
    }
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,3,false);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar3,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,pNVar3);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar3,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,pNVar3);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&structMember,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&memberVariable,(Node *)pVVar4);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&elementVariable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&memberVariable,&queryTarget,"float_struct");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&elementVariable,&queryTarget,"float_array");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar5);
  }
  else {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar2,&queryTarget,3,false);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    this = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&structMember,-1,-1,4,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (this,parentStructure,(Layout *)&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)this);
    pAVar1 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar1,&arrayElement,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pAVar1);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&structMember,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&memberVariable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&memberVariable,&queryTarget,"atomic_uint_array");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&memberVariable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar3,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,pNVar3);
    pAVar1 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar1,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pAVar1);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&structMember,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&memberVariable,(Node *)pVVar4);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&elementVariable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&memberVariable,&queryTarget,"float_struct");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&elementVariable,&queryTarget,"float_array");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar5);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&elementVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&memberVariable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&arrayElement);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&structMember);
  return;
}

Assistant:

static void generateUniformBlockOffsetContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_OFFSET);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .atomic_uint_struct
			// .atomic_uint_array
			{
				const ResourceDefinition::Node::SharedPtr offset			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, 4)));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(offset));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "atomic_uint_array"));
			}

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else if (namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}